

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Float32_To_Int16_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  undefined2 *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  float fVar1;
  float dithered;
  float dither;
  PaInt16 *dest;
  float *src;
  undefined2 *local_38;
  float *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    fVar1 = PaUtil_GenerateFloatTriangularDither(in_R9);
    *local_38 = (short)(int)(*local_30 * 32766.0 + fVar1);
    local_30 = local_30 + in_ECX;
    local_38 = local_38 + in_ESI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Float32_To_Int16_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    PaInt16 *dest = (PaInt16*)destinationBuffer;

    while( count-- )
    {

        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (32766.0f)) + dither;

#ifdef PA_USE_C99_LRINTF
        *dest = lrintf(dithered-0.5f);
#else
        *dest = (PaInt16) dithered;
#endif

        src += sourceStride;
        dest += destinationStride;
    }
}